

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr.c
# Opt level: O0

int raplcap_msr_pd_is_zone_clamped(raplcap *rc,uint32_t pkg,uint32_t die,raplcap_zone zone)

{
  int iVar1;
  raplcap_msr *ctx;
  off_t msr_00;
  bool local_49;
  off_t msr;
  raplcap_msr *state;
  int cl [2];
  uint64_t msrval;
  raplcap_zone zone_local;
  uint32_t die_local;
  uint32_t pkg_local;
  raplcap *rc_local;
  
  state = (raplcap_msr *)0x100000001;
  ctx = get_state(rc,pkg,die);
  msr_00 = zone_to_msr_offset(zone,ZONE_OFFSETS_PL);
  if (((ctx != (raplcap_msr *)0x0) && (-1 < msr_00)) &&
     (iVar1 = msr_sys_read(ctx->sys,(uint64_t *)cl,pkg,die,msr_00), iVar1 == 0)) {
    msr_is_zone_clamped(&ctx->ctx,zone,(uint64_t)cl,(int *)&state,(int *)((long)&state + 4));
    local_49 = false;
    if ((int)state != 0) {
      local_49 = state._4_4_ != 0;
    }
    return (uint)local_49;
  }
  return -1;
}

Assistant:

int raplcap_msr_pd_is_zone_clamped(const raplcap* rc, uint32_t pkg, uint32_t die, raplcap_zone zone) {
  uint64_t msrval;
  int cl[2] = { 1, 1 };
  const raplcap_msr* state = get_state(rc, pkg, die);
  const off_t msr = zone_to_msr_offset(zone, ZONE_OFFSETS_PL);
  raplcap_log(DEBUG, "raplcap_msr_pd_is_zone_clamped: pkg=%"PRIu32", die=%"PRIu32", zone=%d\n", pkg, die, zone);
  if (state == NULL || msr < 0 || msr_sys_read(state->sys, &msrval, pkg, die, msr)) {
    return -1;
  }
  msr_is_zone_clamped(&state->ctx, zone, msrval, &cl[0], &cl[1]);
  return cl[0] && cl[1];
}